

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::MixTexture::writeTo(MixTexture *this,BinaryWriter *binary)

{
  BinaryWriter *in_RSI;
  Texture *in_RDI;
  vec3f *in_stack_ffffffffffffff48;
  BinaryWriter *in_stack_ffffffffffffff50;
  BinaryWriter *this_00;
  
  Texture::writeTo(in_RDI,in_RSI);
  this_00 = in_RSI;
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff50,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,(SP *)in_RDI);
  BinaryWriter::write<int>(in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x226c8a);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff50,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,(SP *)in_RDI);
  BinaryWriter::write<int>(in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x226ced);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_RSI,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffff48);
  BinaryWriter::serialize(this_00,(SP *)in_RDI);
  BinaryWriter::write<int>(in_RSI,(int *)in_stack_ffffffffffffff48);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x226d4a);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_stack_ffffffffffffff48);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_stack_ffffffffffffff48);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,in_stack_ffffffffffffff48);
  return 0x27;
}

Assistant:

int MixTexture::writeTo(BinaryWriter &binary) 
  {
    Texture::writeTo(binary);
    binary.write(binary.serialize(map_amount));
    binary.write(binary.serialize(tex1));
    binary.write(binary.serialize(tex2));
    binary.write(scale1);
    binary.write(scale2);
    binary.write(amount);
    return TYPE_MIX_TEXTURE;
  }